

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball_view.cpp
# Opt level: O3

void __thiscall lumeview::ArcBallView::set_viewport(ArcBallView *this,ivec4 *vp)

{
  int iVar1;
  LumeviewError *this_00;
  int iVar2;
  stringstream ss;
  string local_1d0;
  undefined8 local_1b0;
  ostream local_1a0 [376];
  
  WindowEventListener::set_viewport(&this->super_WindowEventListener,vp);
  iVar1 = (vp->field_0).field_0.z - (vp->field_0).field_0.x;
  if ((iVar1 != 0) && (iVar2 = (vp->field_0).field_0.w - (vp->field_0).field_0.y, iVar2 != 0)) {
    local_1b0._4_4_ = (float)iVar2;
    local_1b0._0_4_ = (float)iVar1;
    ArcBall::set_frame(&this->m_arcBall,(vec2 *)&local_1b0);
    local_1b0._0_4_ = (undefined4)(int)*(undefined8 *)&vp->field_0;
    local_1b0._4_4_ = (undefined4)(int)((ulong)*(undefined8 *)&vp->field_0 >> 0x20);
    ArcBall::set_offset(&this->m_arcBall,(vec2 *)&local_1b0);
    View::set_viewport(&this->m_view,vp);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Bad viewport spefified: ",0x18);
  glm::detail::print_vector_on<char,std::char_traits<char>,glm::tvec4,int,(glm::precision)0>
            (local_1a0,vp);
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  LumeviewError::LumeviewError(this_00,&local_1d0);
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

void ArcBallView::set_viewport (const glm::ivec4& vp)
{
	base_t::set_viewport (vp);
    COND_THROW((vp.x == vp.z) || (vp.y == vp.w),
               "Bad viewport spefified: " << vp);
    m_arcBall.set_frame (glm::vec2(vp.z - vp.x, vp.w - vp.y));
    m_arcBall.set_offset (glm::vec2(vp.x, vp.y));
    m_view.set_viewport (vp);
}